

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O3

MessageProcessingResult __thiscall
helics::TimeCoordinator::checkTimeGrant(TimeCoordinator *this,GlobalFederateId triggerFed)

{
  int32_t *piVar1;
  IterationRequest IVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  Time desiredGrantTime;
  long lVar8;
  pointer pDVar9;
  GrantDelayMode delayMode;
  bool bVar10;
  byte bVar11;
  uint8_t uVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  pointer pDVar16;
  char cVar17;
  
  (*(this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[2])();
  lVar7 = (this->time_allow).internalTimeCode;
  desiredGrantTime.internalTimeCode = (this->time_exec).internalTimeCode;
  if (lVar7 == 0x7fffffffffffffff && desiredGrantTime.internalTimeCode == 0x7fffffffffffffff) {
    (this->time_granted).internalTimeCode = 0x7fffffffffffffff;
    (this->time_grantBase).internalTimeCode = 0x7fffffffffffffff;
    BaseTimeCoordinator::disconnect(&this->super_BaseTimeCoordinator);
    return HALTED;
  }
  lVar8 = (this->time_block).internalTimeCode;
  if ((lVar8 == 0x7fffffffffffffff || desiredGrantTime.internalTimeCode < lVar8) &&
     (lVar8 = (this->time_requested).internalTimeCode,
     (desiredGrantTime.internalTimeCode < lVar8 & (this->super_BaseTimeCoordinator).nonGranting) !=
     1)) {
    IVar2 = this->iterating;
    cVar17 = this->needSendAll;
    this->needSendAll = false;
    if (IVar2 - 1 < 2) {
      if (desiredGrantTime.internalTimeCode < lVar7) {
        if (((this->time_granted).internalTimeCode < desiredGrantTime.internalTimeCode) &&
           (this->hasIterationData != true)) {
          if (IVar2 == FORCE_ITERATION) {
            LOCK();
            (this->iteration).super___atomic_base<int>._M_i =
                 (this->iteration).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          else {
            LOCK();
            (this->iteration).super___atomic_base<int>._M_i = 0;
            UNLOCK();
            (this->super_BaseTimeCoordinator).sequenceCounter = 0;
          }
          updateTimeGrant(this);
          return (this->iterating == FORCE_ITERATION) * '\x02';
        }
LAB_002fcbc8:
        LOCK();
        (this->iteration).super___atomic_base<int>._M_i =
             (this->iteration).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        this->hasIterationData = false;
        goto LAB_002fcbd6;
      }
      if (lVar7 == desiredGrantTime.internalTimeCode) {
        if (desiredGrantTime.internalTimeCode == lVar8) {
          if ((this->info).wait_for_current_time_updates == false) goto LAB_002fcc35;
        }
        else {
          bVar10 = TimeDependencies::checkIfReadyForTimeGrant
                             (&(this->super_BaseTimeCoordinator).dependencies,true,desiredGrantTime,
                              (this->info).wait_for_current_time_updates * '\x02');
          if (bVar10) {
            if (this->hasIterationData != false) goto LAB_002fcbc8;
            lVar7 = (this->time_exec).internalTimeCode;
            if ((this->time_granted).internalTimeCode < lVar7) {
LAB_002fcc35:
              if (this->iterating == FORCE_ITERATION) {
                LOCK();
                (this->iteration).super___atomic_base<int>._M_i =
                     (this->iteration).super___atomic_base<int>._M_i + 1;
                UNLOCK();
                this->hasIterationData = false;
                (this->time_exec).internalTimeCode = (this->time_granted).internalTimeCode;
LAB_002fcbd6:
                updateTimeGrant(this);
                return ITERATING;
              }
              goto LAB_002fcbf3;
            }
            bVar10 = (this->info).wait_for_current_time_updates;
            bVar3 = (this->info).restrictive_time_policy;
            bVar13 = bVar10 ^ 1;
            bVar11 = 0x32;
            bVar15 = bVar3;
            if (bVar10 == false) {
              pDVar16 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pDVar9 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                       super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (pDVar16 != pDVar9) {
                iVar5 = (this->super_BaseTimeCoordinator).sequenceCounter;
                bVar14 = bVar13;
                do {
                  if (((pDVar16->dependency == true) &&
                      ((pDVar16->super_TimeData).next.internalTimeCode <= lVar7)) &&
                     (pDVar16->connection != SELF)) {
                    iVar6 = (pDVar16->super_TimeData).responseSequenceCounter;
                    bVar13 = bVar14;
                    if ((pDVar16->super_TimeData).minFed.gid !=
                        (this->super_BaseTimeCoordinator).mSourceId.gid) {
                      bVar13 = 0;
                    }
                    bVar14 = bVar13;
                    if ((iVar6 == iVar5 & bVar3) == 1) {
                      bVar4 = (pDVar16->super_TimeData).restrictionLevel;
                      if (bVar4 <= bVar11) {
                        bVar11 = bVar4;
                      }
                    }
                    else if (iVar6 != iVar5) {
                      bVar13 = 0;
                      bVar15 = 0;
                      break;
                    }
                  }
                  pDVar16 = pDVar16 + 1;
                } while (pDVar16 != pDVar9);
              }
            }
            if ((bVar13 & 1) == 0) {
              if (bVar15 != 0) {
                uVar12 = bVar11 + 1;
LAB_002fcde5:
                this->currentRestrictionLevel = uVar12;
                piVar1 = &(this->super_BaseTimeCoordinator).sequenceCounter;
                *piVar1 = *piVar1 + 1;
                cVar17 = '\x01';
              }
            }
            else {
              if ((bVar3 == false) || (bVar11 != 0)) goto LAB_002fcc35;
              uVar12 = '\x01';
              if (this->currentRestrictionLevel != '\x01') goto LAB_002fcde5;
            }
          }
        }
      }
    }
    else if (IVar2 == NO_ITERATIONS) {
      if (desiredGrantTime.internalTimeCode < lVar7) {
LAB_002fcbf3:
        LOCK();
        (this->iteration).super___atomic_base<int>._M_i = 0;
        UNLOCK();
LAB_002fcbfe:
        (this->super_BaseTimeCoordinator).sequenceCounter = 0;
        this->hasIterationData = false;
        updateTimeGrant(this);
        return NEXT_STEP;
      }
      if (lVar7 == desiredGrantTime.internalTimeCode) {
        bVar10 = (this->info).wait_for_current_time_updates;
        if (lVar8 <= desiredGrantTime.internalTimeCode && bVar10 == false) goto LAB_002fcbf3;
        delayMode = WAITING;
        if (bVar10 == false) {
          delayMode = desiredGrantTime.internalTimeCode < lVar8;
        }
        bVar10 = TimeDependencies::checkIfReadyForTimeGrant
                           (&(this->super_BaseTimeCoordinator).dependencies,false,desiredGrantTime,
                            delayMode);
        if (bVar10) {
          LOCK();
          (this->iteration).super___atomic_base<int>._M_i = 0;
          UNLOCK();
          goto LAB_002fcbfe;
        }
      }
    }
    if ((triggerFed.gid == -1700000000) || (triggerFed.gid == -2010000000)) {
      if (cVar17 == '\0') {
        return CONTINUE_PROCESSING;
      }
    }
    else if (cVar17 == '\0') goto LAB_002fcb79;
    sendTimeRequest(this,(GlobalFederateId)0x8831d580);
  }
  else {
    if (triggerFed.gid == -2010000000) {
      return CONTINUE_PROCESSING;
    }
    if (triggerFed.gid == -1700000000) {
      return CONTINUE_PROCESSING;
    }
LAB_002fcb79:
    if ((this->super_BaseTimeCoordinator).mSourceId.gid != triggerFed.gid) {
      sendTimeRequest(this,triggerFed);
    }
  }
  return CONTINUE_PROCESSING;
}

Assistant:

MessageProcessingResult TimeCoordinator::checkTimeGrant(GlobalFederateId triggerFed)
{
    updateTimeFactors();
    if (time_exec == Time::maxVal()) {
        if (time_allow == Time::maxVal()) {
            time_granted = Time::maxVal();
            time_grantBase = Time::maxVal();
            disconnect();
            return MessageProcessingResult::HALTED;
        }
    }
    if (time_block <= time_exec && time_block < Time::maxVal()) {
        if (triggerFed.isValid()) {
            if (triggerFed != mSourceId) {
                sendTimeRequest(triggerFed);
            }
        }
        return MessageProcessingResult::CONTINUE_PROCESSING;
    }
    if ((nonGranting && time_exec < time_requested)) {
        if (triggerFed.isValid()) {
            if (triggerFed != mSourceId) {
                sendTimeRequest(triggerFed);
            }
        }
        return MessageProcessingResult::CONTINUE_PROCESSING;
    }
    // if ((iterating == IterationRequest::NO_ITERATIONS) ||
    //     (time_exec > time_granted && iterating == IterationRequest::ITERATE_IF_NEEDED)) {
    //
    //     if (time_allow > time_exec) {
    //         iteration = 0;
    //         updateTimeGrant();
    //         return MessageProcessingResult::NEXT_STEP;
    //     }
    //     if (time_allow == time_exec) {
    //         if (!info.wait_for_current_time_updates) {
    //             if (time_requested <= time_exec) {
    //                 // this is the non interrupted case
    //                 iteration = 0;
    //                 updateTimeGrant();
    //                 return MessageProcessingResult::NEXT_STEP;
    //             }
    //             if (dependencies.checkIfReadyForTimeGrant(false, time_exec)) {
    //                 iteration = 0;
    //                 updateTimeGrant();
    //                 return MessageProcessingResult::NEXT_STEP;
    //             }
    //         } else {
    //             // if the wait_for_current_time_updates flag is set then time_allow must be
    //             greater
    //             // than time_exec
    //         }
    //     }
    // } else {
    //     if (time_allow > time_exec) {
    //         ++iteration;
    //         updateTimeGrant();
    //         return MessageProcessingResult::ITERATING;
    //     }
    //     if (time_allow == time_exec)  // time_allow==time_exec==time_granted
    //     {
    //         if (dependencies.checkIfReadyForTimeGrant(true, time_exec)) {
    //             ++iteration;
    //             updateTimeGrant();
    //             return MessageProcessingResult::ITERATING;
    //         }
    //     }
    // }
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;
    bool sendAll{needSendAll};
    needSendAll = false;
    switch (iterating) {
        case IterationRequest::NO_ITERATIONS:
            if (time_allow > time_exec) {
                iteration = 0;
                sequenceCounter = 0;
                hasIterationData = false;
                updateTimeGrant();
                return MessageProcessingResult::NEXT_STEP;
            }
            if (time_allow == time_exec) {
                if (!info.wait_for_current_time_updates) {
                    if (time_requested <= time_exec) {
                        // this is the non interrupted case
                        iteration = 0;
                        sequenceCounter = 0;
                        hasIterationData = false;
                        updateTimeGrant();
                        return MessageProcessingResult::NEXT_STEP;
                    }
                }

                auto delayMode =
                    getDelayMode(info.wait_for_current_time_updates, (time_requested > time_exec));
                if (dependencies.checkIfReadyForTimeGrant(false, time_exec, delayMode)) {
                    iteration = 0;
                    sequenceCounter = 0;
                    hasIterationData = false;
                    updateTimeGrant();
                    return MessageProcessingResult::NEXT_STEP;
                }

                // if the wait_for_current_time_updates flag is set then time_allow must be greater
                // than time_exec
            }
            break;
        case IterationRequest::ITERATE_IF_NEEDED:
        case IterationRequest::FORCE_ITERATION:
            if (time_allow > time_exec) {
                if (time_exec <= time_granted || hasIterationData) {
                    ++iteration;
                    hasIterationData = false;
                    updateTimeGrant();
                    return MessageProcessingResult::ITERATING;
                }
                if (iterating == IterationRequest::FORCE_ITERATION) {
                    ++iteration;
                } else {
                    iteration = 0;
                    sequenceCounter = 0;
                }

                updateTimeGrant();
                return (iterating == IterationRequest::FORCE_ITERATION) ?
                    MessageProcessingResult::ITERATING :
                    MessageProcessingResult::NEXT_STEP;
            }

            if (time_allow == time_exec) {
                if (time_allow == time_requested) {
                    if (!info.wait_for_current_time_updates) {
                        if (time_requested <= time_exec) {
                            // this is the non interrupted case
                            ret = MessageProcessingResult::NEXT_STEP;
                            break;
                        }
                        if (dependencies.checkIfReadyForTimeGrant(false,
                                                                  time_exec,
                                                                  GrantDelayMode::NONE)) {
                            ret = MessageProcessingResult::NEXT_STEP;
                            break;
                        }
                    }
                    ret = MessageProcessingResult::CONTINUE_PROCESSING;
                    break;
                }
                if (dependencies.checkIfReadyForTimeGrant(
                        true, time_exec, getDelayMode(info.wait_for_current_time_updates, false))) {
                    if (hasIterationData) {
                        ret = MessageProcessingResult::ITERATING;
                        break;
                    }
                    if (time_exec > time_granted) {
                        ret = MessageProcessingResult::NEXT_STEP;
                        break;
                    }
                    // time_
                    bool allowed{!info.wait_for_current_time_updates};
                    bool restricted{info.restrictive_time_policy};
                    bool restrictionAdvance{restricted};
                    int restrictionLevel{50};
                    if (allowed) {
                        for (const auto& dep : dependencies) {
                            if (!dep.dependency) {
                                continue;
                            }
                            if (dep.next > time_exec || dep.connection == ConnectionType::SELF) {
                                continue;
                            }

                            if (dep.minFed != mSourceId) {
                                allowed = false;
                            }
                            if (dep.responseSequenceCounter == sequenceCounter) {
                                if (restricted) {
                                    restrictionLevel =
                                        (std::min)(restrictionLevel,
                                                   static_cast<int>(dep.restrictionLevel));
                                }

                            } else {
                                restrictionAdvance = false;
                                allowed = false;
                                break;
                            }
                        }
                    }
                    if (allowed) {
                        if (restricted) {
                            if (restrictionLevel >= 1) {
                                ret = MessageProcessingResult::NEXT_STEP;
                            } else {
                                if (currentRestrictionLevel != restrictionLevel + 1) {
                                    currentRestrictionLevel = restrictionLevel + 1;
                                    sendAll = true;
                                    ++sequenceCounter;
                                }

                                ret = MessageProcessingResult::CONTINUE_PROCESSING;
                            }
                        } else {
                            ret = MessageProcessingResult::NEXT_STEP;
                        }

                    } else {
                        if (restrictionAdvance) {
                            currentRestrictionLevel = restrictionLevel + 1;
                            sendAll = true;
                            ++sequenceCounter;
                        }
                        ret = MessageProcessingResult::CONTINUE_PROCESSING;
                    }
                }
            }

            break;
        default:
            break;
    }

    switch (ret) {
        case MessageProcessingResult::CONTINUE_PROCESSING:
            if (triggerFed.isValid() || sendAll) {
                if (sendAll) {
                    sendTimeRequest(GlobalFederateId{});
                } else {
                    if (triggerFed != mSourceId) {
                        sendTimeRequest(triggerFed);
                    }
                }
            }
            break;
        case MessageProcessingResult::ITERATING:
            ++iteration;
            hasIterationData = false;
            updateTimeGrant();
            break;
        case MessageProcessingResult::NEXT_STEP:
            if (iterating == IterationRequest::FORCE_ITERATION) {
                ++iteration;
                hasIterationData = false;
                time_exec = time_granted;
                updateTimeGrant();
                ret = MessageProcessingResult::ITERATING;
            } else {
                iteration = 0;
                sequenceCounter = 0;
                hasIterationData = false;
                updateTimeGrant();
            }
            break;
        default:
            break;
    }

    return ret;
}